

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ProgressBar(float fraction,ImVec2 *size_arg,char *overlay)

{
  ImVec2 p_max;
  ImVec2 p_min;
  bool bVar1;
  ImGuiWindow *pIVar2;
  long in_RSI;
  float in_XMM0_Da;
  float t;
  float fVar3;
  ImVec2 IVar4;
  float unaff_retaddr;
  ImU32 unaff_retaddr_00;
  ImRect *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  ImVec2 overlay_size;
  char overlay_buf [32];
  ImVec2 fill_br;
  ImRect bb;
  ImVec2 size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff20;
  ImVec2 in_stack_ffffffffffffff28;
  ImDrawList *pIVar5;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  ImVec2 in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  ImVec2 *in_stack_ffffffffffffff58;
  ImVec2 *in_stack_ffffffffffffff60;
  ImVec2 in_stack_ffffffffffffff70;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78 [2];
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  ImVec2 local_38;
  ImGuiStyle *local_30;
  float in_stack_fffffffffffffff8;
  
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    local_30 = &GImGui->Style;
    local_38 = (pIVar2->DC).CursorPos;
    CalcItemWidth();
    CalcItemSize(in_stack_ffffffffffffff28,(float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                 (float)in_stack_ffffffffffffff20);
    IVar4 = operator+(in_stack_ffffffffffffff08,(ImVec2 *)0x194b4e);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffa8,&local_38,(ImVec2 *)&stack0xffffffffffffffa0);
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28.y);
    bVar1 = ItemAdd((ImRect *)in_stack_ffffffffffffff38,(ImGuiID)in_stack_ffffffffffffff34,
                    (ImRect *)in_stack_ffffffffffffff28);
    if (bVar1) {
      t = ImSaturate(in_XMM0_Da);
      fVar3 = in_stack_ffffffffffffffac;
      GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                  (float)in_stack_ffffffffffffff20);
      p_min.y = in_stack_ffffffffffffffb4;
      p_min.x = in_stack_ffffffffffffffb0;
      p_max.y = in_stack_ffffffffffffffac;
      p_max.x = in_stack_ffffffffffffffa8;
      RenderFrame(p_min,p_max,(ImU32)IVar4.y,IVar4.x._3_1_,fVar3);
      ImVec2::ImVec2(local_78,-local_30->FrameBorderSize,-local_30->FrameBorderSize);
      ImRect::Expand((ImRect *)&stack0xffffffffffffffa8,local_78);
      fVar3 = ImLerp<float>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,t);
      ImVec2::ImVec2(&local_80,fVar3,in_stack_ffffffffffffffb4);
      ImVec2::ImVec2(&local_88,0.0,-0.1);
      ImRect::Expand((ImRect *)&stack0xffffffffffffffa8,&local_88);
      pIVar5 = pIVar2->DrawList;
      GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                  (float)in_stack_ffffffffffffff20);
      RenderRectFilledRangeH
                (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,t,
                 in_stack_fffffffffffffff8);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff70,0.0,0.1);
      ImRect::Expand((ImRect *)&stack0xffffffffffffffa8,(ImVec2 *)&stack0xffffffffffffff70);
      if (in_RSI == 0) {
        ImFormatString((char *)(double)(t * 100.0 + 0.01),(size_t)&stack0xffffffffffffff48,
                       (char *)0x20,"%.0f%%");
      }
      IVar4 = CalcTextSize((char *)in_stack_ffffffffffffff38,
                           (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           SUB81((ulong)pIVar5 >> 0x38,0),SUB84(pIVar5,0));
      if (0.0 < IVar4.x) {
        fVar3 = ImClamp<float>(local_80.x + (local_30->ItemSpacing).x,in_stack_ffffffffffffffa8,
                               (in_stack_ffffffffffffffb0 - IVar4.x) -
                               (local_30->ItemInnerSpacing).x);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff38,fVar3,in_stack_ffffffffffffffac);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff30,0.0,0.5);
        RenderTextClipped(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(ImVec2 *)IVar4,
                          (ImVec2 *)in_stack_ffffffffffffff38,(ImRect *)in_stack_ffffffffffffff70);
      }
    }
  }
  return;
}

Assistant:

void ImGui::ProgressBar(float fraction, const ImVec2& size_arg, const char* overlay)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    ImVec2 pos = window->DC.CursorPos;
    ImVec2 size = CalcItemSize(size_arg, CalcItemWidth(), g.FontSize + style.FramePadding.y * 2.0f);
    ImRect bb(pos, pos + size);
    ItemSize(size, style.FramePadding.y);
    if (!ItemAdd(bb, 0))
        return;

    // Render
    fraction = ImSaturate(fraction);
    RenderFrame(bb.Min, bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);
    bb.Expand(ImVec2(-style.FrameBorderSize, -style.FrameBorderSize));
    const ImVec2 fill_br = ImVec2(ImLerp(bb.Min.x, bb.Max.x, fraction), bb.Max.y);
    bb.Expand(ImVec2(0, -0.1));
    RenderRectFilledRangeH(window->DrawList, bb, GetColorU32(ImGuiCol_PlotHistogram), 0.0f, fraction, style.FrameRounding);
    bb.Expand(ImVec2(0, +0.1));

    // Default displaying the fraction as percentage string, but user can override it
    char overlay_buf[32];
    if (!overlay)
    {
        ImFormatString(overlay_buf, IM_ARRAYSIZE(overlay_buf), "%.0f%%", fraction * 100 + 0.01f);
        overlay = overlay_buf;
    }

    ImVec2 overlay_size = CalcTextSize(overlay, NULL);
    if (overlay_size.x > 0.0f)
        RenderTextClipped(ImVec2(ImClamp(fill_br.x + style.ItemSpacing.x, bb.Min.x, bb.Max.x - overlay_size.x - style.ItemInnerSpacing.x), bb.Min.y), bb.Max, overlay, NULL, &overlay_size, ImVec2(0.0f, 0.5f), &bb);
}